

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

string * __thiscall
ruckig::join<std::array<double,3ul>>
          (string *__return_storage_ptr__,ruckig *this,array<double,_3UL> *array,bool high_precision
          )

{
  size_t i;
  long lVar1;
  ostringstream ss;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
    }
    if ((char)array != '\0') {
      *(undefined8 *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 8)) = 0x10;
    }
    std::ostream::_M_insert<double>(*(double *)(this + lVar1 * 8));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

inline std::string join(const Vector& array, bool high_precision = false) {
    std::ostringstream ss;
    for (size_t i = 0; i < array.size(); ++i) {
        if (i) ss << ", ";
        if (high_precision) ss << std::setprecision(16);
        ss << array[i];
    }
    return ss.str();
}